

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O1

void __thiscall
Centaurus::ATNMachine<wchar_t>::add_transition_from(ATNMachine<wchar_t> *this,int src)

{
  pointer pAVar1;
  undefined8 local_8;
  
  pAVar1 = (this->m_nodes).
           super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_8 = (ulong)((int)((ulong)((long)(this->m_nodes).
                                        super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1)
                         >> 3) * 0x286bca1b - 1) << 0x20;
  std::vector<Centaurus::ATNTransition<wchar_t>,std::allocator<Centaurus::ATNTransition<wchar_t>>>::
  emplace_back<int&,int&>
            ((vector<Centaurus::ATNTransition<wchar_t>,std::allocator<Centaurus::ATNTransition<wchar_t>>>
              *)&pAVar1[src].m_transitions,(int *)((long)&local_8 + 4),(int *)&local_8);
  return;
}

Assistant:

void add_transition_from(int src)
    {
        m_nodes[src].add_transition(m_nodes.size() - 1);
    }